

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O3

void * __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
try_allocate_page<(density::detail::page_allocation_type)1>
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,
          progress_guarantee i_progress_guarantee)

{
  WF_PageStack *pWVar1;
  __pointer_type pPVar2;
  PageAllocatorSlot *pPVar3;
  uintptr_t uint_pointer;
  PageFooter *pPVar4;
  PageStack local_30;
  
  if ((this->m_pages_to_unpin).m_first != (PageFooter *)0x0) {
    process_pending_unpins_impl(i_progress_guarantee);
  }
  pPVar4 = PageStack::pop_unpinned(&this->m_private_zeroed_page_stack);
  if (pPVar4 == (PageFooter *)0x0) {
    pPVar3 = this->m_current_slot;
    LOCK();
    pWVar1 = &pPVar3->m_zeroed_page_stack;
    pPVar2 = (pWVar1->m_first)._M_b._M_p;
    (pWVar1->m_first)._M_b._M_p = (__pointer_type)0x1;
    UNLOCK();
    if (pPVar2 != (__pointer_type)0x1) {
      local_30.m_cached_last = (PageFooter *)0x0;
      local_30.m_first = pPVar2;
      pPVar4 = PageStack::pop_unpinned(&local_30);
      LOCK();
      (pPVar3->m_zeroed_page_stack).m_first._M_b._M_p = local_30.m_first;
      UNLOCK();
      if (pPVar4 != (PageFooter *)0x0) goto LAB_00aa1ead;
    }
    pPVar4 = try_steal_and_allocate(this,zeroed);
    if (pPVar4 == (PageFooter *)0x0) {
      pPVar4 = allocate_page_slow_path(this,zeroed,i_progress_guarantee);
    }
  }
LAB_00aa1ead:
  return (void *)((ulong)pPVar4 & 0xffffffffffff0000);
}

Assistant:

void * try_allocate_page(progress_guarantee i_progress_guarantee) noexcept
            {
                process_pending_unpins(i_progress_guarantee);

                // try from the private stack...
                auto * new_page = get_private_stack(ALLOCATION_TYPE).pop_unpinned();
                if (new_page == nullptr)
                {
                    // ...then from the current slot...
                    new_page = m_current_slot->get_stack(ALLOCATION_TYPE).try_pop_unpinned();
                    if (new_page == nullptr)
                    {
                        // ...else try to steal all the pages from the victim slot...
                        new_page = try_steal_and_allocate(ALLOCATION_TYPE);

                        // if still do not have a page, we go to the next level
                        if (new_page == nullptr)
                        {
                            new_page =
                              allocate_page_slow_path(ALLOCATION_TYPE, i_progress_guarantee);
                        }
                    }
                }

                // flush any pending write
                if (enable_relaxed_atomics)
                    std::atomic_thread_fence(std::memory_order_release);

                return address_lower_align(new_page, page_alignment);
            }